

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O2

DeepTiledInputFile * __thiscall
Imf_2_5::MultiPartInputFile::getInputPart<Imf_2_5::DeepTiledInputFile>
          (MultiPartInputFile *this,int partNumber)

{
  Data *this_00;
  iterator iVar1;
  mapped_type *ppGVar2;
  DeepTiledInputFile *this_01;
  InputPartData *part;
  int partNumber_local;
  Lock local_38;
  pair<int,_Imf_2_5::GenericInputFile_*> local_28;
  
  local_38._mutex = (Mutex *)this->_data;
  partNumber_local = partNumber;
  std::mutex::lock(local_38._mutex);
  local_38._locked = true;
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_Imf_2_5::GenericInputFile_*>,_std::_Select1st<std::pair<const_int,_Imf_2_5::GenericInputFile_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericInputFile_*>_>_>
          ::find(&(this->_data->_inputFiles)._M_t,&partNumber_local);
  this_00 = this->_data;
  if ((_Rb_tree_header *)iVar1._M_node == &(this_00->_inputFiles)._M_t._M_impl.super__Rb_tree_header
     ) {
    this_01 = (DeepTiledInputFile *)operator_new(0x10);
    part = Data::getPart(this_00,partNumber_local);
    DeepTiledInputFile::DeepTiledInputFile(this_01,part);
    local_28.first = partNumber_local;
    local_28.second = (GenericInputFile *)this_01;
    std::
    _Rb_tree<int,std::pair<int_const,Imf_2_5::GenericInputFile*>,std::_Select1st<std::pair<int_const,Imf_2_5::GenericInputFile*>>,std::less<int>,std::allocator<std::pair<int_const,Imf_2_5::GenericInputFile*>>>
    ::_M_emplace_unique<std::pair<int,Imf_2_5::GenericInputFile*>>
              ((_Rb_tree<int,std::pair<int_const,Imf_2_5::GenericInputFile*>,std::_Select1st<std::pair<int_const,Imf_2_5::GenericInputFile*>>,std::less<int>,std::allocator<std::pair<int_const,Imf_2_5::GenericInputFile*>>>
                *)&this->_data->_inputFiles,&local_28);
  }
  else {
    ppGVar2 = std::
              map<int,_Imf_2_5::GenericInputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericInputFile_*>_>_>
              ::operator[](&this_00->_inputFiles,&partNumber_local);
    this_01 = (DeepTiledInputFile *)*ppGVar2;
  }
  IlmThread_2_5::Lock::~Lock(&local_38);
  return this_01;
}

Assistant:

T*
MultiPartInputFile::getInputPart(int partNumber)
{
    Lock lock(*_data);
            if (_data->_inputFiles.find(partNumber) == _data->_inputFiles.end())
        {
            T* file = new T(_data->getPart(partNumber));
            _data->_inputFiles.insert(std::make_pair(partNumber, (GenericInputFile*) file));
            return file;
        }
        else return (T*) _data->_inputFiles[partNumber];
}